

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O0

Pair * ZXing::OneD::ReadPair(PatternView *view,Direction dir)

{
  bool bVar1;
  int iVar2;
  PatternView *view_00;
  undefined8 in_RSI;
  Direction dir_00;
  Character in_RDI;
  PatternView *unaff_retaddr;
  Character charR;
  Character charL;
  int finder;
  float in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  PatternView *in_stack_ffffffffffffff00;
  Character first;
  Character local_68;
  Character local_60;
  undefined1 in_stack_ffffffffffffffb3;
  int in_stack_ffffffffffffffb4;
  PatternView *in_stack_ffffffffffffffb8;
  Character local_38 [5];
  int local_10;
  
  dir_00 = (Direction)((ulong)in_RSI >> 0x20);
  first = in_RDI;
  DataBar::Finder(in_stack_ffffffffffffff00);
  local_10 = ParseFinderPattern(unaff_retaddr,dir_00);
  if (local_10 == 0) goto LAB_00296b51;
  DataBar::LeftChar(in_stack_ffffffffffffff00);
  local_38[0] = ReadDataCharacter(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                                  (bool)in_stack_ffffffffffffffb3);
  bVar1 = DataBar::Character::operator_cast_to_bool(local_38);
  if (!bVar1) goto LAB_00296b51;
  if (local_10 == 1) {
    local_60 = local_38[0];
    bVar1 = ChecksumIsValid(first);
    if (!bVar1) goto LAB_00296b51;
  }
  DataBar::RightChar(in_stack_ffffffffffffff00);
  bVar1 = PatternView::isValid(in_stack_ffffffffffffff00);
  if (bVar1) {
    DataBar::RightChar(in_stack_ffffffffffffff00);
    DataBar::ModSizeFinder((PatternView *)first);
    bVar1 = DataBar::IsCharacter
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                      );
    if (!bVar1) goto LAB_00296a55;
    DataBar::RightChar(in_stack_ffffffffffffff00);
    local_68 = ReadDataCharacter(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                                 (bool)in_stack_ffffffffffffffb3);
  }
  else {
LAB_00296a55:
    memset(&local_68,0,8);
    DataBar::Character::Character(&local_68);
  }
  bVar1 = DataBar::Character::operator_cast_to_bool(&local_68);
  if ((bVar1) ||
     (bVar1 = Contains<std::array<int,7ul>,int>
                        ((array<int,_7UL> *)in_stack_ffffffffffffff00,
                         (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
     bVar1)) {
    *(Character *)in_RDI = local_38[0];
    *(Character *)((long)in_RDI + 8) = local_68;
    ((Character *)((long)in_RDI + 0x10))->value = local_10;
    iVar2 = PatternView::pixelsInFront(in_stack_ffffffffffffff00);
    *(int *)((long)in_RDI + 0x14) = iVar2;
    view_00 = (PatternView *)((long)in_RDI + 0x18);
    bVar1 = DataBar::Character::operator_cast_to_bool(&local_68);
    if (bVar1) {
      DataBar::RightChar(view_00);
    }
    else {
      DataBar::Finder(view_00);
    }
    iVar2 = PatternView::pixelsTillEnd(view_00);
    *(int *)&view_00->_data = iVar2;
    *(int *)((long)in_RDI + 0x1c) = -1;
    ((Character *)((long)in_RDI + 0x20))->value = 1;
    return (Pair *)first;
  }
LAB_00296b51:
  *(undefined4 *)in_RDI = 0xffffffff;
  *(int *)((long)in_RDI + 4) = 0;
  ((Character *)((long)in_RDI + 8))->value = -1;
  *(int *)((long)in_RDI + 0xc) = 0;
  ((Character *)((long)in_RDI + 0x10))->value = 0;
  *(int *)((long)in_RDI + 0x14) = -1;
  ((Character *)((long)in_RDI + 0x18))->value = 1;
  *(int *)((long)in_RDI + 0x1c) = -1;
  ((Character *)((long)in_RDI + 0x20))->value = 1;
  return (Pair *)first;
}

Assistant:

static Pair ReadPair(const PatternView& view, Direction dir)
{
	if (int finder = ParseFinderPattern(Finder(view), dir))
		if (auto charL = ReadDataCharacter(LeftChar(view), finder, false))
			if (finder != FINDER_A || ChecksumIsValid(charL)) {
				auto charR = RightChar(view).isValid() && IsCharacter(RightChar(view), 17, ModSizeFinder(view))
								 ? ReadDataCharacter(RightChar(view), finder, true)
								 : Character();
				if (charR || Contains(VALID_HALF_PAIRS, finder))
					return {charL, charR, finder, view.pixelsInFront(),
							(charR ? RightChar(view) : Finder(view)).pixelsTillEnd()};
			}

	return {};
}